

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRefactor(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int fUseDcs;
  int fUseZeros;
  int fUpdateLevel;
  int nConeSizeMax;
  int nNodeSizeMax;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fUpdateLevel = 10;
  fUseZeros = 0x10;
  fUseDcs = 1;
  fVerbose = 0;
  local_48 = 0;
  local_4c = 0;
  Extra_UtilGetoptReset();
LAB_0026f141:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nlzvh");
    if (iVar1 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command can only be applied to an AIG (run \"strash\").\n");
        return 1;
      }
      iVar1 = Abc_NtkGetChoiceNum(pNtk_00);
      if (iVar1 != 0) {
        Abc_Print(-1,"AIG resynthesis cannot be applied to AIGs with choice nodes.\n");
        return 1;
      }
      if (0xf < fUpdateLevel) {
        Abc_Print(-1,"The cone size cannot exceed 15.\n");
        return 1;
      }
      if ((local_48 != 0) && (fUseZeros <= fUpdateLevel)) {
        Abc_Print(-1,
                  "For don\'t-care to work, containing cone should be larger than collapsed node.\n"
                 );
        return 1;
      }
      iVar1 = Abc_NtkRefactor(pNtk_00,fUpdateLevel,fUseZeros,fUseDcs,fVerbose,local_48,local_4c);
      if (iVar1 == 0) {
        Abc_Print(-1,"Refactoring has failed.\n");
        return 1;
      }
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_0026f3ad;
      }
      fUseZeros = atoi(argv[globalUtilOptind]);
      iVar1 = fUseZeros;
      break;
    default:
      goto LAB_0026f3ad;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_0026f3ad;
      }
      fUpdateLevel = atoi(argv[globalUtilOptind]);
      iVar1 = fUpdateLevel;
      break;
    case 100:
      local_48 = local_48 ^ 1;
      goto LAB_0026f141;
    case 0x68:
      goto LAB_0026f3ad;
    case 0x6c:
      fUseDcs = fUseDcs ^ 1;
      goto LAB_0026f141;
    case 0x76:
      local_4c = local_4c ^ 1;
      goto LAB_0026f141;
    case 0x7a:
      fVerbose = fVerbose ^ 1;
      goto LAB_0026f141;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0026f3ad:
      Abc_Print(-2,"usage: refactor [-N <num>] [-lzvh]\n");
      Abc_Print(-2,"\t           performs technology-independent refactoring of the AIG\n");
      Abc_Print(-2,"\t-N <num> : the max support of the collapsed node [default = %d]\n",
                (ulong)(uint)fUpdateLevel);
      pcVar2 = "no";
      if (fUseDcs != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-l       : toggle preserving the number of levels [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-z       : toggle using zero-cost replacements [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_4c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandRefactor( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nNodeSizeMax;
    int nConeSizeMax;
    int fUpdateLevel;
    int fUseZeros;
    int fUseDcs;
    int fVerbose;
    extern int Abc_NtkRefactor( Abc_Ntk_t * pNtk, int nNodeSizeMax, int nConeSizeMax, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose );

    // set defaults
    nNodeSizeMax = 10;
    nConeSizeMax = 16;
    fUpdateLevel =  1;
    fUseZeros    =  0;
    fUseDcs      =  0;
    fVerbose     =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nlzvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConeSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConeSizeMax < 0 )
                goto usage;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'z':
            fUseZeros ^= 1;
            break;
        case 'd':
            fUseDcs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to an AIG (run \"strash\").\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        Abc_Print( -1, "AIG resynthesis cannot be applied to AIGs with choice nodes.\n" );
        return 1;
    }
    if ( nNodeSizeMax > 15 )
    {
        Abc_Print( -1, "The cone size cannot exceed 15.\n" );
        return 1;
    }

    if ( fUseDcs && nNodeSizeMax >= nConeSizeMax )
    {
        Abc_Print( -1, "For don't-care to work, containing cone should be larger than collapsed node.\n" );
        return 1;
    }

    // modify the current network
    if ( !Abc_NtkRefactor( pNtk, nNodeSizeMax, nConeSizeMax, fUpdateLevel, fUseZeros, fUseDcs, fVerbose ) )
    {
        Abc_Print( -1, "Refactoring has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: refactor [-N <num>] [-lzvh]\n" );
    Abc_Print( -2, "\t           performs technology-independent refactoring of the AIG\n" );
    Abc_Print( -2, "\t-N <num> : the max support of the collapsed node [default = %d]\n", nNodeSizeMax );
//    Abc_Print( -2, "\t-C <num> : the max support of the containing cone [default = %d]\n", nConeSizeMax );
    Abc_Print( -2, "\t-l       : toggle preserving the number of levels [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-z       : toggle using zero-cost replacements [default = %s]\n", fUseZeros? "yes": "no" );
//    Abc_Print( -2, "\t-d       : toggle using don't-cares [default = %s]\n", fUseDcs? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}